

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

void signop_coroutine(PageantAsyncOp *pao)

{
  int iVar1;
  ssh_key *key;
  PageantClient *pc;
  PageantClientRequestId *reqid;
  _Bool _Var2;
  uint uVar3;
  PageantClientRequestId **so_00;
  undefined4 *puVar4;
  char *ptr;
  strbuf *buf;
  ptrlen pVar5;
  byte local_65;
  strbuf *signature;
  char *invalid;
  uint32_t supported_flags;
  int *crLine;
  strbuf *response;
  PageantSignOp *so;
  PageantAsyncOp *pao_local;
  
  so_00 = &pao[-2].reqid;
  puVar4 = (undefined4 *)((long)&pao[-1].info + 4);
  iVar1 = *(int *)((long)&pao[-1].info + 4);
  if (iVar1 == 0) {
LAB_0011b358:
    local_65 = 0;
    if (*(long *)(*so_00 + 10) == 0) {
      local_65 = gui_request_in_progress;
    }
    if ((local_65 & 1) != 0) {
      signop_link_to_pending_gui_request((PageantSignOp *)so_00);
      *puVar4 = 0x1b0;
      return;
    }
    if (*(long *)(*so_00 + 10) == 0) {
      if (*(long *)(*so_00 + 0xc) == 0) {
        __assert_fail("so->pk->encrypted_key_file",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",
                      0x1b5,"void signop_coroutine(PageantAsyncOp *)");
      }
      _Var2 = request_passphrase(pao->info->pc,(PageantKey *)*so_00);
      if (_Var2) {
        signop_link_to_key((PageantSignOp *)so_00);
        *puVar4 = 0x1c0;
        return;
      }
      crLine = (int *)strbuf_new();
      failure(pao->info->pc,pao->reqid,(strbuf *)crLine,*(uchar *)&pao[-1].cr.prev,
              "on-demand decryption could not prompt for a passphrase");
      goto LAB_0011b5bc;
    }
  }
  else {
    if (iVar1 == 0x1b0) {
      signop_unlink((PageantSignOp *)so_00);
      goto LAB_0011b358;
    }
    if (iVar1 != 0x1c0) {
      return;
    }
    signop_unlink((PageantSignOp *)so_00);
  }
  uVar3 = ssh_key_supported_flags((ssh_key *)**(undefined8 **)(*so_00 + 10));
  if ((*(uint *)&pao[-1].info & (uVar3 ^ 0xffffffff)) == 0) {
    ptr = ssh_key_invalid((ssh_key *)**(undefined8 **)(*so_00 + 10),*(uint *)&pao[-1].info);
    if (ptr == (char *)0x0) {
      buf = strbuf_new();
      key = (ssh_key *)**(undefined8 **)(*so_00 + 10);
      pVar5 = ptrlen_from_strbuf((strbuf *)pao[-1].vt);
      ssh_key_sign(key,pVar5,*(uint *)&pao[-1].info,buf->binarysink_);
      crLine = (int *)strbuf_new();
      BinarySink_put_byte(((strbuf *)crLine)->binarysink_,'\x0e');
      BinarySink_put_stringsb(((strbuf *)crLine)->binarysink_,buf);
    }
    else {
      crLine = (int *)strbuf_new();
      failure(pao->info->pc,pao->reqid,(strbuf *)crLine,*(uchar *)&pao[-1].cr.prev,"key invalid: %s"
              ,ptr);
      safefree(ptr);
    }
  }
  else {
    crLine = (int *)strbuf_new();
    failure(pao->info->pc,pao->reqid,(strbuf *)crLine,*(uchar *)&pao[-1].cr.prev,
            "unsupported flag bits 0x%08x",(ulong)(*(uint *)&pao[-1].info & (uVar3 ^ 0xffffffff)));
  }
LAB_0011b5bc:
  pc = pao->info->pc;
  reqid = pao->reqid;
  pVar5 = ptrlen_from_strbuf((strbuf *)crLine);
  pageant_client_got_response(pc,reqid,pVar5);
  strbuf_free((strbuf *)crLine);
  pageant_async_op_unlink_and_free(pao);
  return;
}

Assistant:

static void signop_coroutine(PageantAsyncOp *pao)
{
    PageantSignOp *so = container_of(pao, PageantSignOp, pao);
    strbuf *response;

    crBegin(so->crLine);

    while (!so->pk->skey && gui_request_in_progress) {
        signop_link_to_pending_gui_request(so);
        crReturnV;
        signop_unlink(so);
    }

    if (!so->pk->skey) {
        assert(so->pk->encrypted_key_file);

        if (!request_passphrase(so->pao.info->pc, so->pk)) {
            response = strbuf_new();
            failure(so->pao.info->pc, so->pao.reqid, response,
                    so->failure_type, "on-demand decryption could not "
                    "prompt for a passphrase");
            goto respond;
        }

        signop_link_to_key(so);
        crReturnV;
        signop_unlink(so);
    }

    uint32_t supported_flags = ssh_key_supported_flags(so->pk->skey->key);
    if (so->flags & ~supported_flags) {
        /*
         * We MUST reject any message containing flags we don't
         * understand.
         */
        response = strbuf_new();
        failure(so->pao.info->pc, so->pao.reqid, response, so->failure_type,
                "unsupported flag bits 0x%08"PRIx32,
                so->flags & ~supported_flags);
        goto respond;
    }

    char *invalid = ssh_key_invalid(so->pk->skey->key, so->flags);
    if (invalid) {
        response = strbuf_new();
        failure(so->pao.info->pc, so->pao.reqid, response, so->failure_type,
                "key invalid: %s", invalid);
        sfree(invalid);
        goto respond;
    }

    strbuf *signature = strbuf_new();
    ssh_key_sign(so->pk->skey->key, ptrlen_from_strbuf(so->data_to_sign),
                 so->flags, BinarySink_UPCAST(signature));

    response = strbuf_new();
    put_byte(response, SSH2_AGENT_SIGN_RESPONSE);
    put_stringsb(response, signature);

  respond:
    pageant_client_got_response(so->pao.info->pc, so->pao.reqid,
                                ptrlen_from_strbuf(response));
    strbuf_free(response);

    pageant_async_op_unlink_and_free(&so->pao);
    crFinishFreedV;
}